

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

void __thiscall
testing::internal::
PairMatcherImpl<std::pair<std::__cxx11::string_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>
::PairMatcherImpl<char_const*,proto2_unittest::Proto2MapEnumPlusExtra>
          (PairMatcherImpl<std::pair<std::__cxx11::string_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>
           *this,char *first_matcher,Proto2MapEnumPlusExtra second_matcher)

{
  Proto2MapEnumPlusExtra local_1c;
  
  *(undefined ***)this = &PTR__PairMatcherImpl_018a72d0;
  local_1c = second_matcher;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           *)(this + 8),first_matcher);
  Matcher<const_proto2_unittest::Proto2MapEnumPlusExtra_&>::Matcher
            ((Matcher<const_proto2_unittest::Proto2MapEnumPlusExtra_&> *)(this + 0x20),&local_1c);
  return;
}

Assistant:

PairMatcherImpl(FirstMatcher first_matcher, SecondMatcher second_matcher)
      : first_matcher_(
            testing::SafeMatcherCast<const FirstType&>(first_matcher)),
        second_matcher_(
            testing::SafeMatcherCast<const SecondType&>(second_matcher)) {}